

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_props.cpp
# Opt level: O1

int32_t icu_63::ICU_Utility::parsePattern
                  (UnicodeString *rule,int32_t pos,int32_t limit,UnicodeString *pattern,
                  int32_t *parsedInts)

{
  short sVar1;
  bool bVar2;
  UBool UVar3;
  uint uVar4;
  int32_t iVar5;
  UChar32 UVar6;
  uint uVar7;
  char16_t *pcVar8;
  long lVar9;
  char16_t cVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  int32_t p;
  uint local_54;
  int local_50;
  uint local_4c;
  char16_t *local_48;
  int32_t *local_40;
  char16_t *local_38;
  
  sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  uVar4 = (uint)sVar1;
  if (sVar1 < 0) {
    uVar7 = (pattern->fUnion).fFields.fLength;
  }
  else {
    uVar7 = (int)uVar4 >> 5;
  }
  bVar2 = 0 < (int)uVar7;
  local_54 = pos;
  if (0 < (int)uVar7) {
    local_38 = (char16_t *)((long)&pattern->fUnion + 2);
    local_48 = (char16_t *)((long)&rule->fUnion + 2);
    uVar11 = 0;
    iVar12 = 0;
    local_50 = limit;
    local_40 = parsedInts;
    do {
      cVar10 = L'\xffff';
      if (uVar11 < uVar7) {
        pcVar8 = local_38;
        if ((uVar4 & 2) == 0) {
          pcVar8 = (pattern->fUnion).fFields.fArray;
        }
        cVar10 = pcVar8[uVar11];
      }
      if (cVar10 == L'~') {
LAB_00382df8:
        uVar4 = skipWhitespace(rule,(int32_t *)&local_54,'\0');
LAB_00382e07:
        bVar13 = true;
        local_54 = uVar4;
      }
      else {
        if (cVar10 == L'#') {
          local_4c = local_54;
          iVar5 = parseInteger(rule,(int32_t *)&local_4c,local_50);
          lVar9 = (long)iVar12;
          iVar12 = iVar12 + 1;
          local_40[lVar9] = iVar5;
          uVar4 = local_4c;
          if (local_4c != local_54) goto LAB_00382e07;
        }
        else if (cVar10 == L' ') {
          if ((int)local_54 < local_50) {
            sVar1 = (rule->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              uVar4 = (rule->fUnion).fFields.fLength;
            }
            else {
              uVar4 = (int)sVar1 >> 5;
            }
            uVar7 = 0xffff;
            if (local_54 < uVar4) {
              pcVar8 = local_48;
              if (((int)sVar1 & 2U) == 0) {
                pcVar8 = (rule->fUnion).fFields.fArray;
              }
              uVar7 = (uint)(ushort)pcVar8[(int)local_54];
            }
            local_54 = local_54 + 1;
            UVar3 = PatternProps::isWhiteSpace(uVar7);
            if (UVar3 != '\0') goto LAB_00382df8;
          }
        }
        else if ((int)local_54 < local_50) {
          sVar1 = (rule->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            uVar4 = (rule->fUnion).fFields.fLength;
          }
          else {
            uVar4 = (int)sVar1 >> 5;
          }
          uVar7 = 0xffff;
          if (local_54 < uVar4) {
            pcVar8 = local_48;
            if (((int)sVar1 & 2U) == 0) {
              pcVar8 = (rule->fUnion).fFields.fArray;
            }
            uVar7 = (uint)(ushort)pcVar8[(int)local_54];
          }
          local_54 = local_54 + 1;
          UVar6 = u_tolower_63(uVar7);
          bVar13 = cVar10 == (char16_t)UVar6;
          goto LAB_00382e3e;
        }
        bVar13 = false;
      }
LAB_00382e3e:
      if (!bVar13) break;
      sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
      uVar4 = (uint)sVar1;
      if (sVar1 < 0) {
        uVar7 = (pattern->fUnion).fFields.fLength;
      }
      else {
        uVar7 = (int)uVar4 >> 5;
      }
      uVar11 = uVar11 + 1;
      bVar2 = (long)uVar11 < (long)(int)uVar7;
    } while ((long)uVar11 < (long)(int)uVar7);
  }
  uVar4 = 0xffffffff;
  if (!bVar2) {
    uVar4 = local_54;
  }
  return uVar4;
}

Assistant:

int32_t ICU_Utility::parsePattern(const UnicodeString& rule, int32_t pos, int32_t limit,
                              const UnicodeString& pattern, int32_t* parsedInts) {
    // TODO Update this to handle surrogates
    int32_t p;
    int32_t intCount = 0; // number of integers parsed
    for (int32_t i=0; i<pattern.length(); ++i) {
        UChar cpat = pattern.charAt(i);
        UChar c;
        switch (cpat) {
        case 32 /*' '*/:
            if (pos >= limit) {
                return -1;
            }
            c = rule.charAt(pos++);
            if (!PatternProps::isWhiteSpace(c)) {
                return -1;
            }
            // FALL THROUGH to skipWhitespace
            U_FALLTHROUGH;
        case 126 /*'~'*/:
            pos = skipWhitespace(rule, pos);
            break;
        case 35 /*'#'*/:
            p = pos;
            parsedInts[intCount++] = parseInteger(rule, p, limit);
            if (p == pos) {
                // Syntax error; failed to parse integer
                return -1;
            }
            pos = p;
            break;
        default:
            if (pos >= limit) {
                return -1;
            }
            c = (UChar) u_tolower(rule.charAt(pos++));
            if (c != cpat) {
                return -1;
            }
            break;
        }
    }
    return pos;
}